

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O0

void __thiscall RhombicToricLattice::createVertexToEdges(RhombicToricLattice *this)

{
  int iVar1;
  long *in_RDI;
  int sign_2;
  int sign_1;
  int sign;
  cartesian4 coordinate;
  int vertexIndex;
  value_type_conflict1 *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  allocator *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  allocator local_2c1;
  string local_2c0 [32];
  undefined4 local_2a0;
  allocator local_299;
  string local_298 [32];
  undefined4 local_278;
  allocator local_271;
  string local_270 [32];
  undefined4 local_250;
  allocator local_249;
  string local_248 [36];
  undefined4 local_224;
  undefined4 local_220;
  allocator local_219;
  string local_218 [32];
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  undefined4 local_1d0;
  allocator local_1c9;
  string local_1c8 [32];
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [36];
  undefined4 local_17c;
  undefined4 local_178;
  allocator local_171;
  string local_170 [32];
  undefined4 local_150;
  allocator local_149;
  string local_148 [32];
  undefined4 local_128;
  allocator local_121;
  string local_120 [32];
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [32];
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [32];
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [32];
  undefined4 local_88;
  allocator local_81;
  string local_80 [32];
  undefined4 local_60;
  allocator local_49;
  string local_48 [36];
  undefined4 local_24;
  undefined4 local_20;
  cartesian4 local_1c;
  int local_c;
  
  for (local_c = 0; local_c < (int)in_RDI[1] * 2 * (int)in_RDI[1] * (int)in_RDI[1];
      local_c = local_c + 1) {
    local_1c = Lattice::indexToCoordinate
                         ((Lattice *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    if (local_1c.w == 0) {
      if ((local_1c.x + local_1c.y + local_1c.z) % 2 == 0) {
        local_20 = 1;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"xyz",&local_49);
        local_24 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_48,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"xy",&local_81);
        local_60 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_80,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"xz",&local_a9);
        local_88 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_a8,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"yz",&local_d1);
        local_b0 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_d0,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        local_20 = 0xffffffff;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"xyz",&local_f9);
        local_d8 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_f8,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"xy",&local_121);
        local_100 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_120,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"xz",&local_149);
        local_128 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_148,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x11),(long)local_c);
        iVar1 = local_c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"yz",&local_171);
        local_150 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_170,local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                   in_stack_fffffffffffffb28);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
    }
    else if ((local_1c.x + local_1c.y + local_1c.z) % 2 == 0) {
      local_178 = 1;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"xy",&local_1a1);
      local_17c = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_1a0,local_178);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"xz",&local_1c9);
      local_1a8 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_1c8,local_178);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"yz",&local_1f1);
      local_1d0 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_1f0,local_178);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      local_178 = 0xffffffff;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"xyz",&local_219);
      local_1f8 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_218,local_178);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
    }
    else {
      local_220 = 0xffffffff;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"xy",&local_249);
      local_224 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_248,local_220);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"xz",&local_271);
      local_250 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_270,local_220);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_298,"yz",&local_299);
      in_stack_fffffffffffffb54 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_298,local_220);
      local_278 = in_stack_fffffffffffffb54;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      local_220 = 1;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x11),(long)local_c);
      iVar1 = local_c;
      in_stack_fffffffffffffb48 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"xyz",in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb34 = (**(code **)(*in_RDI + 0x10))(in_RDI,iVar1,local_2c0,local_220);
      local_2a0 = in_stack_fffffffffffffb34;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    }
  }
  return;
}

Assistant:

void RhombicToricLattice::createVertexToEdges()
{
    for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
            }
        }
        else
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
            else
            {
                int sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
        }
    }
}